

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O1

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dest,int inputSize,int maxOutputSize,
              limitedOutput_directive limit,size_t sufficient_len,int fullUpdate)

{
  int *pIn;
  byte *pInLimit;
  ushort uVar1;
  undefined4 uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint *puVar10;
  int *pIn_00;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint32_t uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  BYTE *pBVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int *__src;
  int *piVar26;
  size_t price_2;
  ulong uVar27;
  long lVar28;
  long lVar29;
  undefined2 *puVar30;
  BYTE *e;
  char *pcVar31;
  ulong uVar32;
  char *pcVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  char *pcVar37;
  byte *pbVar38;
  bool bVar39;
  U16 *chainTable;
  U32 *HashTable;
  LZ4HC_optimal_t opt [4097];
  LZ4HC_match_t matches [4097];
  undefined2 *puStack_18168;
  int *piStack_18160;
  uint16_t *puStack_18158;
  undefined2 *puStack_18130;
  uint16_t *puStack_18108;
  uint16_t *puStack_180f8;
  int iStack_180e4;
  ulong uStack_180d0;
  uint16_t *puStack_180c8;
  undefined2 *puStack_180c0;
  int iStack_18098;
  int iStack_18078;
  uint8_t *puStack_18058;
  undefined8 uStack_18050;
  undefined1 auStack_18048 [8];
  undefined8 uStack_18040;
  uint auStack_18038 [16382];
  int aiStack_8040 [8196];
  
  uVar24 = 0xfff;
  if (sufficient_len < 0xfff) {
    uVar24 = sufficient_len;
  }
  ctx->end = ctx->end + inputSize;
  __src = (int *)source;
  pcVar33 = dest;
  if (0xd < inputSize) {
    pInLimit = (byte *)(source + (long)inputSize + -5);
    piStack_18160 = (int *)(source + 1);
    do {
      auStack_18048 = (undefined1  [8])0x0;
      uStack_18040 = 0;
      puVar3 = ctx->base;
      uVar36 = (ulong)ctx->nextToUpdate;
      iVar8 = 0;
      iVar35 = (int)puVar3;
      if (puVar3 + uVar36 <= piStack_18160) {
        iVar12 = (int)piStack_18160;
        if ((fullUpdate != 0) && (ctx->nextToUpdate < (uint)(iVar12 - iVar35))) {
          uVar9 = ctx->dictLimit;
          uVar34 = ctx->lowLimit;
          puVar4 = ctx->dictBase;
          do {
            uVar11 = (uint)uVar36;
            uVar15 = uVar11 - 0xfffe;
            if (uVar36 < uVar34 + 0xffff) {
              uVar15 = uVar34;
            }
            if (puVar3 + uVar36 + 4 <= pInLimit) {
              piVar26 = (int *)(puVar3 + uVar36);
              uVar14 = ctx->searchNum;
              uVar5 = (uint)(*piVar26 * -0x61c8864f) >> 0x11;
              uVar21 = ctx->hashTable[uVar5];
              uVar16 = (ulong)uVar21;
              ctx->hashTable[uVar5] = uVar11;
              uVar17 = (ulong)((uVar11 & 0xffff) << 2);
              puStack_18158 = (uint16_t *)((long)ctx->chainTable + uVar17 + 2);
              puVar30 = (undefined2 *)((long)ctx->chainTable + uVar17);
              if (uVar16 < uVar36) {
                uVar11 = uVar11 - uVar21;
                uStack_180d0 = 8;
                uVar21 = uVar11;
                while( true ) {
                  bVar39 = uVar14 == 0;
                  uVar14 = uVar14 - 1;
                  uVar5 = (uint)uVar16;
                  if ((uVar5 < uVar15) || (bVar39)) break;
                  if (uVar9 < uVar5 || uVar9 - uVar5 == 0) {
                    pBVar20 = puVar3 + uVar16;
                    uVar6 = LZ4_count((BYTE *)piVar26,pBVar20,pInLimit);
                    uVar17 = (ulong)uVar6;
                  }
                  else {
                    pbVar38 = (byte *)((ulong)(uVar9 - uVar5) + (long)piVar26);
                    pBVar20 = puVar4 + uVar16;
                    if (pInLimit < pbVar38) {
                      pbVar38 = pInLimit;
                    }
                    uVar6 = LZ4_count((BYTE *)piVar26,pBVar20,pbVar38);
                    uVar17 = (ulong)uVar6;
                    if ((pbVar38 < pInLimit) && ((byte *)((long)piVar26 + uVar17) == pbVar38)) {
                      uVar6 = LZ4_count((byte *)((long)piVar26 + uVar17),puVar3 + uVar9,pInLimit);
                      uVar17 = uVar17 + uVar6;
                    }
                  }
                  if (((uStack_180d0 < uVar17) && (uStack_180d0 = uVar17, 0x1000 < uVar17)) ||
                     (pInLimit <= (byte *)((long)piVar26 + uVar17))) break;
                  uVar16 = (ulong)((uVar5 & 0xffff) * 2);
                  if (*(byte *)((long)piVar26 + uVar17) < pBVar20[uVar17]) {
                    *puStack_18158 = (uint16_t)uVar21;
                    puStack_18158 = ctx->chainTable + uVar16;
                    uVar21 = (uint)ctx->chainTable[uVar16];
                    if (ctx->chainTable[uVar16] == 0xffff) break;
                    uVar11 = uVar11 + uVar21;
                    uVar6 = uVar21;
                  }
                  else {
                    *puVar30 = (short)uVar11;
                    puVar30 = (undefined2 *)((long)ctx->chainTable + (uVar16 * 2 | 2));
                    uVar11 = (uint)ctx->chainTable[uVar16 + 1];
                    if (ctx->chainTable[uVar16 + 1] == 0xffff) break;
                    uVar21 = uVar21 + uVar11;
                    uVar6 = uVar11;
                  }
                  uVar16 = (ulong)(uVar5 - uVar6);
                  if (uVar36 <= uVar16) break;
                }
              }
              *puStack_18158 = 0xffff;
              *puVar30 = 0xffff;
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 < (uint)(iVar12 - iVar35));
        }
        uVar34 = iVar12 - iVar35;
        uVar9 = uVar34 - 0xfffe;
        if (uVar34 < ctx->lowLimit + 0xffff) {
          uVar9 = ctx->lowLimit;
        }
        iVar8 = 0;
        if (piStack_18160 + 1 <= pInLimit) {
          uVar11 = ctx->dictLimit;
          puVar4 = ctx->dictBase;
          uVar14 = ctx->searchNum;
          uVar21 = (uint)(*piStack_18160 * -0x61c8864f) >> 0x11;
          uVar15 = ctx->hashTable[uVar21];
          ctx->hashTable[uVar21] = uVar34;
          uVar36 = (ulong)((uVar34 & 0xffff) << 2);
          puStack_18108 = (uint16_t *)((long)ctx->chainTable + uVar36 + 2);
          puStack_18168 = (undefined2 *)((long)ctx->chainTable + uVar36);
          iVar8 = 0;
          uVar21 = uVar34 - uVar15;
          if (uVar15 <= uVar34 && uVar21 != 0) {
            uStack_180d0 = 3;
            iVar8 = 0;
            uVar5 = uVar21;
            do {
              bVar39 = uVar14 == 0;
              uVar14 = uVar14 - 1;
              if ((uVar15 < uVar9) || (bVar39)) break;
              if (uVar15 < uVar11) {
                pbVar38 = (byte *)((ulong)(uVar11 - uVar15) + (long)piStack_18160);
                pBVar20 = puVar4 + uVar15;
                if (pInLimit < pbVar38) {
                  pbVar38 = pInLimit;
                }
                uVar6 = LZ4_count((BYTE *)piStack_18160,pBVar20,pbVar38);
                uVar36 = (ulong)uVar6;
                if ((pbVar38 < pInLimit) && ((byte *)((long)piStack_18160 + uVar36) == pbVar38)) {
                  uVar6 = LZ4_count((byte *)((long)piStack_18160 + uVar36),puVar3 + uVar11,pInLimit)
                  ;
                  uVar36 = uVar36 + uVar6;
                }
              }
              else {
                pBVar20 = puVar3 + uVar15;
                uVar6 = LZ4_count((BYTE *)piStack_18160,pBVar20,pInLimit);
                uVar36 = (ulong)uVar6;
              }
              if (uStack_180d0 < uVar36) {
                iVar7 = iVar35 + uVar15;
                if (uVar11 <= uVar15) {
                  iVar7 = (int)pBVar20;
                }
                aiStack_8040[(long)iVar8 * 2 + 2] = iVar12 - iVar7;
                aiStack_8040[(long)iVar8 * 2 + 3] = (int)uVar36;
                iVar8 = iVar8 + 1;
                uStack_180d0 = uVar36;
                if (0x1000 < uVar36) break;
              }
              if (pInLimit <= (byte *)((long)piStack_18160 + uVar36)) break;
              uVar6 = (uVar15 & 0xffff) * 2;
              if (*(byte *)((long)piStack_18160 + uVar36) < pBVar20[uVar36]) {
                *puStack_18108 = (uint16_t)uVar5;
                puStack_18108 = ctx->chainTable + uVar6;
                uVar1 = ctx->chainTable[uVar6];
                if (uVar1 == 0xffff) break;
                uVar5 = (uint)uVar1;
                uVar21 = uVar21 + uVar5;
                uVar6 = (uint)uVar1;
              }
              else {
                *puStack_18168 = (short)uVar21;
                puStack_18168 = (undefined2 *)((long)ctx->chainTable + ((ulong)uVar6 * 2 | 2));
                uVar21 = (uint)ctx->chainTable[(ulong)uVar6 + 1];
                if (ctx->chainTable[(ulong)uVar6 + 1] == 0xffff) break;
                uVar5 = uVar5 + uVar21;
                uVar6 = uVar21;
              }
              uVar15 = uVar15 - uVar6;
            } while (uVar15 < uVar34);
          }
          *puStack_18108 = 0xffff;
          *puStack_18168 = 0xffff;
        }
        ctx->nextToUpdate = uVar34 + 1;
      }
      if (iVar8 == 0) {
        piStack_18160 = (int *)((long)piStack_18160 + 1);
        iStack_180e4 = 0;
      }
      else {
        lVar22 = (long)iVar8;
        uVar36 = (ulong)aiStack_8040[lVar22 * 2 + 1];
        if (uVar24 < uVar36) {
          iStack_18078 = aiStack_8040[lVar22 * 2];
          uVar18 = 1;
          uVar27 = 0;
        }
        else {
          uVar16 = (long)piStack_18160 - (long)__src;
          uVar17 = uVar16 + 1 + (uVar16 - 0xf) / 0xff;
          if (uVar16 < 0xf) {
            uVar17 = uVar16;
          }
          iVar8 = (int)uVar17 + 3;
          uVar18 = 0;
          lVar23 = 0;
          do {
            if (lVar23 == 0) {
              uVar27 = 4;
            }
            else {
              uVar27 = (long)aiStack_8040[lVar23 * 2 + 1] + 1;
            }
            uVar36 = (ulong)aiStack_8040[lVar23 * 2 + 3];
            if (uVar27 <= uVar36) {
              iVar12 = aiStack_8040[lVar23 * 2 + 2];
              do {
                iVar7 = iVar8;
                if (0x12 < uVar27) {
                  iVar7 = (int)((uVar27 - 0x13) / 0xff) + iVar8 + 1;
                }
                if (uVar18 < uVar27) {
                  puVar10 = auStack_18038 + uVar18 * 4;
                  do {
                    uVar18 = uVar18 + 1;
                    *puVar10 = 0x40000000;
                    puVar10 = puVar10 + 4;
                  } while (uVar18 < uVar27);
                }
                auStack_18038[uVar27 * 4 + -2] = (uint)uVar27;
                *(int *)(auStack_18048 + uVar27 * 0x10 + 4) = iVar12;
                auStack_18038[uVar27 * 4 + -1] = 0;
                *(int *)(auStack_18048 + uVar27 * 0x10) = iVar7 - (int)uVar17;
                uVar27 = uVar27 + 1;
              } while (uVar27 <= uVar36);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != lVar22);
          if (uVar18 < 4) {
            piStack_18160 = (int *)((long)piStack_18160 + 1);
            iStack_180e4 = 0;
            goto LAB_0013ec16;
          }
          auStack_18038[2] = 1;
          uStack_18040 = CONCAT44(uStack_18040._4_4_,1);
          uVar17 = uVar16 + 1 + (uVar16 - 0xf) / 0xff;
          if (uVar16 < 0xf) {
            uVar17 = uVar16;
          }
          uVar27 = 1;
          do {
            lVar22 = uVar27 * 0x10;
            if (*(int *)(&uStack_18050 + uVar27 * 2) == 1) {
              lVar23 = (long)*(int *)((long)&uStack_18050 + lVar22 + 4);
              uVar13 = lVar23 + 1;
              if (uVar27 < uVar13 || uVar27 - uVar13 == 0) {
                uVar25 = uVar13 + uVar16;
                if (0xe < uVar25) {
                  uVar25 = uVar25 + (uVar25 - 0xf) / 0xff + 1;
                }
                uVar25 = uVar25 - uVar17;
              }
              else {
                uVar25 = uVar13;
                if (0xe < (uint)uVar13) {
                  uVar25 = uVar13 + (lVar23 - 0xeU) / 0xff + 1;
                }
                uVar25 = (long)*(int *)(auStack_18048 + (uVar27 - uVar13) * 0x10) + uVar25;
              }
            }
            else {
              uVar25 = (long)*(int *)(&puStack_18058 + uVar27 * 2) + 1;
              uVar13 = 1;
            }
            piVar26 = (int *)(auStack_18048 + lVar22);
            if (uVar25 < (ulong)(long)*piVar26) {
              if (uVar18 < uVar27) {
                puVar10 = auStack_18038 + uVar18 * 4;
                do {
                  uVar18 = uVar18 + 1;
                  *puVar10 = 0x40000000;
                  puVar10 = puVar10 + 4;
                } while (uVar27 != uVar18);
              }
              *(undefined8 *)(auStack_18048 + lVar22 + 4) = 0x100000000;
              auStack_18038[uVar27 * 4 + -1] = (uint)uVar13;
              *piVar26 = (int)uVar25;
            }
            iStack_180e4 = 0xd;
            if ((uVar27 != uVar18) &&
               (pIn_00 = (int *)((long)piStack_18160 + uVar27),
               pIn_00 < source + (long)inputSize + -0xc)) {
              uVar25 = (ulong)ctx->nextToUpdate;
              iStack_180e4 = 0;
              iVar8 = 0;
              if (puVar3 + uVar25 <= pIn_00) {
                iVar12 = (int)pIn_00;
                if ((fullUpdate != 0) && (ctx->nextToUpdate < (uint)(iVar12 - iVar35))) {
                  uVar9 = ctx->dictLimit;
                  uVar34 = ctx->lowLimit;
                  uStack_18050 = ctx->dictBase;
                  puStack_18058 = puVar3 + uVar9;
                  do {
                    uVar11 = (uint)uVar25;
                    uVar15 = uVar11 - 0xfffe;
                    if (uVar25 < uVar34 + 0xffff) {
                      uVar15 = uVar34;
                    }
                    if (puVar3 + uVar25 + 4 <= pInLimit) {
                      pIn = (int *)(puVar3 + uVar25);
                      uVar14 = ctx->searchNum;
                      uVar5 = (uint)(*pIn * -0x61c8864f) >> 0x11;
                      uVar21 = ctx->hashTable[uVar5];
                      uVar32 = (ulong)uVar21;
                      ctx->hashTable[uVar5] = uVar11;
                      uVar13 = (ulong)((uVar11 & 0xffff) << 2);
                      puStack_180f8 = (uint16_t *)((long)ctx->chainTable + uVar13 + 2);
                      puStack_18130 = (undefined2 *)((long)ctx->chainTable + uVar13);
                      if (uVar32 < uVar25) {
                        uVar11 = uVar11 - uVar21;
                        puStack_18108 = (uint16_t *)0x8;
                        uVar21 = uVar11;
                        while( true ) {
                          bVar39 = uVar14 == 0;
                          uVar14 = uVar14 - 1;
                          uVar5 = (uint)uVar32;
                          if ((uVar5 < uVar15) || (bVar39)) break;
                          if (uVar9 < uVar5 || uVar9 - uVar5 == 0) {
                            puStack_18158 = (uint16_t *)(puVar3 + uVar32);
                            uVar6 = LZ4_count((BYTE *)pIn,(BYTE *)puStack_18158,pInLimit);
                            uVar13 = (ulong)uVar6;
                          }
                          else {
                            pbVar38 = (byte *)((ulong)(uVar9 - uVar5) + (long)pIn);
                            puStack_18158 = (uint16_t *)(uStack_18050 + uVar32);
                            if (pInLimit < pbVar38) {
                              pbVar38 = pInLimit;
                            }
                            uVar6 = LZ4_count((BYTE *)pIn,(BYTE *)puStack_18158,pbVar38);
                            uVar13 = (ulong)uVar6;
                            if ((pbVar38 < pInLimit) && ((byte *)((long)pIn + uVar13) == pbVar38)) {
                              uVar6 = LZ4_count((byte *)((long)pIn + uVar13),puStack_18058,pInLimit)
                              ;
                              uVar13 = uVar13 + uVar6;
                            }
                          }
                          if (((puStack_18108 < uVar13) &&
                              (puStack_18108 = (uint16_t *)uVar13, 0x1000 < uVar13)) ||
                             (pInLimit <= (byte *)((long)pIn + uVar13))) break;
                          uVar6 = (uVar5 & 0xffff) * 2;
                          if (*(byte *)((long)pIn + uVar13) <
                              *(byte *)((long)puStack_18158 + uVar13)) {
                            *puStack_180f8 = (uint16_t)uVar21;
                            puStack_180f8 = ctx->chainTable + uVar6;
                            uVar1 = ctx->chainTable[uVar6];
                            if (uVar1 == 0xffff) break;
                            uVar21 = (uint)uVar1;
                            uVar11 = uVar11 + uVar21;
                            uVar6 = (uint)uVar1;
                          }
                          else {
                            *puStack_18130 = (short)uVar11;
                            puStack_18130 =
                                 (undefined2 *)((long)ctx->chainTable + ((ulong)uVar6 * 2 | 2));
                            uVar11 = (uint)ctx->chainTable[(ulong)uVar6 + 1];
                            if (ctx->chainTable[(ulong)uVar6 + 1] == 0xffff) break;
                            uVar21 = uVar21 + uVar11;
                            uVar6 = uVar11;
                          }
                          uVar32 = (ulong)(uVar5 - uVar6);
                          if (uVar25 <= uVar32) break;
                        }
                      }
                      *puStack_180f8 = 0xffff;
                      *puStack_18130 = 0xffff;
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < (uint)(iVar12 - iVar35));
                }
                uVar34 = iVar12 - iVar35;
                uVar9 = uVar34 - 0xfffe;
                if (uVar34 < ctx->lowLimit + 0xffff) {
                  uVar9 = ctx->lowLimit;
                }
                iVar8 = 0;
                if (pIn_00 + 1 <= pInLimit) {
                  uVar11 = ctx->dictLimit;
                  puVar4 = ctx->dictBase;
                  uVar14 = ctx->searchNum;
                  uVar21 = (uint)(*pIn_00 * -0x61c8864f) >> 0x11;
                  uVar15 = ctx->hashTable[uVar21];
                  ctx->hashTable[uVar21] = uVar34;
                  uVar25 = (ulong)((uVar34 & 0xffff) << 2);
                  puStack_180c8 = (uint16_t *)((long)ctx->chainTable + uVar25 + 2);
                  puStack_180c0 = (undefined2 *)((long)ctx->chainTable + uVar25);
                  iVar8 = 0;
                  uVar21 = uVar34 - uVar15;
                  if (uVar15 <= uVar34 && uVar21 != 0) {
                    puStack_18130 = (undefined2 *)0x3;
                    iVar8 = 0;
                    uVar5 = uVar21;
                    do {
                      bVar39 = uVar14 == 0;
                      uVar14 = uVar14 - 1;
                      if ((uVar15 < uVar9) || (bVar39)) break;
                      if (uVar15 < uVar11) {
                        pbVar38 = (byte *)((ulong)(uVar11 - uVar15) + (long)pIn_00);
                        puStack_18158 = (uint16_t *)(puVar4 + uVar15);
                        if (pInLimit < pbVar38) {
                          pbVar38 = pInLimit;
                        }
                        uVar6 = LZ4_count((BYTE *)pIn_00,(BYTE *)puStack_18158,pbVar38);
                        uVar25 = (ulong)uVar6;
                        if ((pbVar38 < pInLimit) && ((byte *)((long)pIn_00 + uVar25) == pbVar38)) {
                          uVar6 = LZ4_count((byte *)((long)pIn_00 + uVar25),puVar3 + uVar11,pInLimit
                                           );
                          uVar25 = uVar25 + uVar6;
                        }
                      }
                      else {
                        puStack_18158 = (uint16_t *)(puVar3 + uVar15);
                        uVar6 = LZ4_count((BYTE *)pIn_00,(BYTE *)puStack_18158,pInLimit);
                        uVar25 = (ulong)uVar6;
                      }
                      if (puStack_18130 < uVar25) {
                        iVar7 = iVar35 + uVar15;
                        if (uVar11 <= uVar15) {
                          iVar7 = (int)puStack_18158;
                        }
                        aiStack_8040[(long)iVar8 * 2 + 2] = iVar12 - iVar7;
                        aiStack_8040[(long)iVar8 * 2 + 3] = (int)uVar25;
                        iVar8 = iVar8 + 1;
                        puStack_18130 = (undefined2 *)uVar25;
                        if (0x1000 < uVar25) break;
                      }
                      if (pInLimit <= (byte *)((long)pIn_00 + uVar25)) break;
                      uVar6 = (uVar15 & 0xffff) * 2;
                      if (*(byte *)((long)pIn_00 + uVar25) < *(byte *)((long)puStack_18158 + uVar25)
                         ) {
                        *puStack_180c8 = (ushort)uVar5;
                        puStack_180c8 = ctx->chainTable + uVar6;
                        uVar1 = *puStack_180c8;
                        if (uVar1 == 0xffff) break;
                        uVar5 = (uint)uVar1;
                        uVar21 = uVar21 + uVar5;
                        uVar6 = (uint)uVar1;
                      }
                      else {
                        *puStack_180c0 = (short)uVar21;
                        puStack_180c0 =
                             (undefined2 *)((long)ctx->chainTable + ((ulong)uVar6 * 2 | 2));
                        uVar21 = (uint)ctx->chainTable[(ulong)uVar6 + 1];
                        if (ctx->chainTable[(ulong)uVar6 + 1] == 0xffff) break;
                        uVar5 = uVar5 + uVar21;
                        uVar6 = uVar21;
                      }
                      uVar15 = uVar15 - uVar6;
                    } while (uVar15 < uVar34);
                  }
                  *puStack_180c8 = 0xffff;
                  *puStack_180c0 = 0xffff;
                }
                ctx->nextToUpdate = uVar34 + 1;
              }
              if (iVar8 != 0) {
                lVar22 = (long)iVar8;
                uVar36 = (ulong)aiStack_8040[lVar22 * 2 + 1];
                if (uVar24 < uVar36) {
                  iStack_18078 = aiStack_8040[lVar22 * 2];
                  uVar18 = uVar27 + 1;
                  iStack_180e4 = 4;
                }
                else {
                  lVar23 = 0;
                  do {
                    if (lVar23 == 0) {
                      uVar25 = 4;
                    }
                    else {
                      uVar25 = (long)aiStack_8040[lVar23 * 2 + 1] + 1;
                    }
                    uVar36 = (long)aiStack_8040[lVar23 * 2 + 3];
                    if (0xfff < uVar27 + (long)aiStack_8040[lVar23 * 2 + 3]) {
                      uVar36 = 0x1000 - uVar27;
                    }
                    for (; uVar25 <= uVar36; uVar25 = uVar25 + 1) {
                      if (auStack_18038[uVar27 * 4 + -2] == 1) {
                        uVar9 = auStack_18038[uVar27 * 4 + -1];
                        uVar13 = (ulong)(int)uVar9;
                        lVar29 = uVar27 - uVar13;
                        if (uVar27 < uVar13 || lVar29 == 0) {
                          uVar13 = uVar13 + uVar16;
                          if (0xe < uVar13) {
                            uVar13 = uVar13 + (uVar13 - 0xf) / 0xff + 1;
                          }
                          lVar29 = uVar13 + 3;
                          if (0x12 < uVar25) {
                            lVar29 = lVar29 + (uVar25 - 0x13) / 0xff + 1;
                          }
                          uVar13 = lVar29 - uVar17;
                        }
                        else {
                          if (0xe < uVar9) {
                            uVar13 = uVar13 + (uVar13 - 0xf) / 0xff + 1;
                          }
                          lVar28 = uVar13 + 3;
                          if (0x12 < uVar25) {
                            lVar28 = lVar28 + (uVar25 - 0x13) / 0xff + 1;
                          }
                          uVar13 = *(int *)(auStack_18048 + lVar29 * 0x10) + lVar28;
                        }
                      }
                      else {
                        lVar29 = 3;
                        if (0x12 < uVar25) {
                          lVar29 = (uVar25 - 0x13) / 0xff + 4;
                        }
                        uVar13 = *piVar26 + lVar29;
                        uVar9 = 0;
                      }
                      uVar32 = uVar25 + uVar27;
                      if ((uVar18 < uVar32) ||
                         (uVar13 < (ulong)(long)*(int *)(auStack_18048 + uVar32 * 0x10))) {
                        if (uVar18 < uVar32) {
                          puVar10 = auStack_18038 + uVar18 * 4;
                          do {
                            uVar18 = uVar18 + 1;
                            *puVar10 = 0x40000000;
                            puVar10 = puVar10 + 4;
                          } while (uVar18 < uVar32);
                        }
                        auStack_18038[uVar32 * 4 + -2] = (uint)uVar25;
                        *(int *)(auStack_18048 + uVar32 * 0x10 + 4) = aiStack_8040[lVar23 * 2 + 2];
                        auStack_18038[uVar32 * 4 + -1] = uVar9;
                        *(int *)(auStack_18048 + uVar32 * 0x10) = (int)uVar13;
                      }
                    }
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != lVar22);
                }
              }
            }
            if (iStack_180e4 != 0) {
              if (iStack_180e4 == 4) goto LAB_0013de0f;
              if (iStack_180e4 != 0xd) goto LAB_0013ec16;
              break;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 <= uVar18);
          uVar36 = (ulong)(int)auStack_18038[uVar18 * 4 + -2];
          iStack_18078 = *(int *)(auStack_18048 + uVar18 * 0x10 + 4);
          uVar27 = uVar18 - uVar36;
        }
LAB_0013de0f:
        uStack_18040 = CONCAT44(uStack_18040._4_4_,1);
        iVar35 = iStack_18078;
        do {
          uVar9 = auStack_18038[uVar27 * 4 + -2];
          uVar16 = (ulong)(int)uVar9;
          uVar17 = 0;
          if (uVar16 <= uVar27) {
            uVar17 = uVar16;
          }
          iStack_18078 = *(int *)(auStack_18048 + uVar27 * 0x10 + 4);
          auStack_18038[uVar27 * 4 + -2] = (uint)uVar36;
          *(int *)(auStack_18048 + uVar27 * 0x10 + 4) = iVar35;
          uVar36 = (ulong)uVar9;
          bVar39 = uVar16 <= uVar27;
          uVar27 = uVar27 - uVar17;
          iVar35 = iStack_18078;
        } while (bVar39);
        if (uVar18 != 0) {
          uVar36 = 0;
          pcVar37 = pcVar33;
          do {
            lVar22 = uVar36 * 0x10;
            uVar9 = auStack_18038[uVar36 * 4 + -2];
            lVar23 = (long)(int)uVar9;
            if (lVar23 == 1) {
              uVar36 = uVar36 + 1;
              iStack_180e4 = 0x1c;
              pcVar33 = pcVar37;
              piStack_18160 = (int *)((long)piStack_18160 + 1);
            }
            else {
              uVar36 = uVar36 + lVar23;
              uVar17 = (long)piStack_18160 - (long)__src;
              pcVar33 = pcVar37 + 1;
              uVar2 = *(undefined4 *)(auStack_18048 + lVar22 + 4);
              iStack_180e4 = 1;
              if ((limit == noLimit) ||
                 (pcVar37 + uVar17 + (uVar17 >> 8) + 9 <= dest + maxOutputSize)) {
                if (uVar17 < 0xf) {
                  *pcVar37 = (char)uVar17 << 4;
                  pcVar19 = pcVar33;
                }
                else {
                  uVar16 = uVar17 - 0xf;
                  *pcVar37 = -0x10;
                  if (0xfe < uVar16) {
                    uVar16 = (uVar17 - 0x10e) / 0xff;
                    memset(pcVar33,0xff,uVar16 + 1);
                    pcVar33 = pcVar37 + uVar16 + 2;
                    uVar16 = (uVar16 * -0xff + uVar17) - 0x10e;
                  }
                  *pcVar33 = (char)uVar16;
                  pcVar19 = pcVar33 + 1;
                }
                pcVar31 = pcVar19 + uVar17;
                lVar22 = 0;
                do {
                  pcVar33 = pcVar19 + lVar22;
                  *(undefined8 *)pcVar33 = *(undefined8 *)((long)__src + lVar22);
                  lVar22 = lVar22 + 8;
                } while (pcVar33 + 8 < pcVar31);
                pcVar33 = pcVar31 + 2;
                uVar9 = uVar9 - 4;
                uVar17 = (ulong)(int)uVar9;
                *(short *)pcVar31 = (short)uVar2;
                if ((limit == noLimit) || (pcVar31 + (uVar17 >> 8) + 8 <= dest + maxOutputSize)) {
                  if (uVar9 < 0xf) {
                    *pcVar37 = *pcVar37 + (char)uVar9;
                  }
                  else {
                    *pcVar37 = *pcVar37 + '\x0f';
                    uVar16 = uVar17 - 0xf;
                    if (0x1fd < uVar16) {
                      uVar16 = (uVar17 - 0x20d) / 0x1fe;
                      memset(pcVar33,0xff,uVar16 * 2 + 2);
                      pcVar33 = pcVar19 + (long)piStack_18160 + (uVar16 * 2 - (long)__src) + 4;
                      uVar16 = (uVar16 * -0x1fe + uVar17) - 0x20d;
                    }
                    if (0xfe < uVar16) {
                      uVar16 = uVar16 - 0xff;
                      *pcVar33 = -1;
                      pcVar33 = pcVar33 + 1;
                    }
                    *pcVar33 = (char)uVar16;
                    pcVar33 = pcVar33 + 1;
                  }
                  __src = (int *)((long)piStack_18160 + lVar23);
                  iStack_180e4 = 0;
                  piStack_18160 = __src;
                }
              }
            }
            if ((iStack_180e4 != 0x1c) && (iStack_180e4 != 0)) goto LAB_0013ec16;
            pcVar37 = pcVar33;
          } while (uVar36 < uVar18);
        }
        iStack_180e4 = 0;
      }
LAB_0013ec16:
      if (iStack_180e4 != 0) {
        return 0;
      }
    } while (piStack_18160 < source + (long)inputSize + -0xc);
  }
  pcVar37 = source + ((long)inputSize - (long)__src);
  iVar35 = (int)pcVar37;
  if ((limit == noLimit) ||
     (iStack_18098 = 0,
     (long)(pcVar33 + (ulong)(iVar35 + 0xf0) / 0xff + ((long)iVar35 - (long)dest) + 1) <=
     (long)(ulong)(uint)maxOutputSize)) {
    pcVar19 = pcVar33 + 1;
    if (iVar35 < 0xf) {
      *pcVar33 = (char)pcVar37 << 4;
    }
    else {
      *pcVar33 = -0x10;
      iVar8 = iVar35 + -0xf;
      if (0x10d < iVar35) {
        iVar7 = (int)source + inputSize;
        iVar12 = 0x1fd;
        if (iVar8 < 0x1fd) {
          iVar12 = iVar8;
        }
        uVar9 = (iVar7 - (iVar12 + (int)__src)) + 0xef;
        memset(pcVar19,0xff,(ulong)(uVar9 / 0xff + 1));
        pcVar19 = pcVar33 + (ulong)uVar9 / 0xff + 2;
        pcVar33 = pcVar33 + (ulong)uVar9 / 0xff + 1;
        iVar8 = (iVar7 - (int)__src) + uVar9 / 0xff + -0x10e;
      }
      *pcVar19 = (char)iVar8;
      pcVar19 = pcVar33 + 2;
    }
    memcpy(pcVar19,__src,(size_t)pcVar37);
    iStack_18098 = (int)dest;
    iStack_18098 = ((int)pcVar19 + iVar35) - iStack_18098;
  }
  return iStack_18098;
}

Assistant:

static int LZ4HC_compress_optimal (
    LZ4HC_CCtx_internal* ctx,
    const char* const source,
    char* dest,
    int inputSize,
    int maxOutputSize,
    limitedOutput_directive limit,
    size_t sufficient_len,
    const int fullUpdate
    )
{
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + 1];   /* this uses a bit too much stack memory to my taste ... */
    LZ4HC_match_t matches[LZ4_OPT_NUM + 1];

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + inputSize;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = (iend - LASTLITERALS);
    BYTE* op = (BYTE*) dest;
    BYTE* const oend = op + maxOutputSize;

    /* init */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;
    ctx->end += inputSize;
    ip++;

    /* Main Loop */
    while (ip < mflimit) {
        size_t const llen = ip - anchor;
        size_t last_pos = 0;
        size_t match_num, cur, best_mlen, best_off;
        memset(opt, 0, sizeof(LZ4HC_optimal_t));

        match_num = LZ4HC_BinTree_GetAllMatches(ctx, ip, matchlimit, MINMATCH-1, matches, fullUpdate);
        if (!match_num) { ip++; continue; }

        if ((size_t)matches[match_num-1].len > sufficient_len) {
            /* good enough solution : immediate encoding */
            best_mlen = matches[match_num-1].len;
            best_off = matches[match_num-1].off;
            cur = 0;
            last_pos = 1;
            goto encode;
        }

        /* set prices using matches at position = 0 */
        {   size_t matchNb;
            for (matchNb = 0; matchNb < match_num; matchNb++) {
                size_t mlen = (matchNb>0) ? (size_t)matches[matchNb-1].len+1 : MINMATCH;
                best_mlen = matches[matchNb].len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
                for ( ; mlen <= best_mlen ; mlen++) {
                    size_t const cost = LZ4HC_sequencePrice(llen, mlen) - LZ4HC_literalsPrice(llen);
                    SET_PRICE(mlen, mlen, matches[matchNb].off, 0, cost);   /* updates last_pos and opt[pos] */
        }   }   }

        if (last_pos < MINMATCH) { ip++; continue; }  /* note : on clang at least, this test improves performance */

        /* check further positions */
        opt[0].mlen = opt[1].mlen = 1;
        for (cur = 1; cur <= last_pos; cur++) {
            const BYTE* const curPtr = ip + cur;

            /* establish baseline price if cur is literal */
            {   size_t price, litlen;
                if (opt[cur-1].mlen == 1) {
                    /* no match at previous position */
                    litlen = opt[cur-1].litlen + 1;
                    if (cur > litlen) {
                        price = opt[cur - litlen].price + LZ4HC_literalsPrice(litlen);
                    } else {
                        price = LZ4HC_literalsPrice(llen + litlen) - LZ4HC_literalsPrice(llen);
                    }
                } else {
                    litlen = 1;
                    price = opt[cur - 1].price + LZ4HC_literalsPrice(1);
                }

                if (price < (size_t)opt[cur].price)
                    SET_PRICE(cur, 1, 0, litlen, price);   /* note : increases last_pos */
            }

            if (cur == last_pos || curPtr >= mflimit) break;

            match_num = LZ4HC_BinTree_GetAllMatches(ctx, curPtr, matchlimit, MINMATCH-1, matches, fullUpdate);
            if ((match_num > 0) && (size_t)matches[match_num-1].len > sufficient_len) {
                /* immediate encoding */
                best_mlen = matches[match_num-1].len;
                best_off = matches[match_num-1].off;
                last_pos = cur + 1;
                goto encode;
            }

            /* set prices using matches at position = cur */
            {   size_t matchNb;
                for (matchNb = 0; matchNb < match_num; matchNb++) {
                    size_t ml = (matchNb>0) ? (size_t)matches[matchNb-1].len+1 : MINMATCH;
                    best_mlen = (cur + matches[matchNb].len < LZ4_OPT_NUM) ?
                                (size_t)matches[matchNb].len : LZ4_OPT_NUM - cur;

                    for ( ; ml <= best_mlen ; ml++) {
                        size_t ll, price;
                        if (opt[cur].mlen == 1) {
                            ll = opt[cur].litlen;
                            if (cur > ll)
                                price = opt[cur - ll].price + LZ4HC_sequencePrice(ll, ml);
                            else
                                price = LZ4HC_sequencePrice(llen + ll, ml) - LZ4HC_literalsPrice(llen);
                        } else {
                            ll = 0;
                            price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                        }

                        if (cur + ml > last_pos || price < (size_t)opt[cur + ml].price) {
                            SET_PRICE(cur + ml, ml, matches[matchNb].off, ll, price);
            }   }   }   }
        } /* for (cur = 1; cur <= last_pos; cur++) */

        best_mlen = opt[last_pos].mlen;
        best_off = opt[last_pos].off;
        cur = last_pos - best_mlen;

encode: /* cur, last_pos, best_mlen, best_off must be set */
        opt[0].mlen = 1;
        while (1) {  /* from end to beginning */
            size_t const ml = opt[cur].mlen;
            int const offset = opt[cur].off;
            opt[cur].mlen = (int)best_mlen;
            opt[cur].off = (int)best_off;
            best_mlen = ml;
            best_off = offset;
            if (ml > cur) break;
            cur -= ml;
        }

        /* encode all recorded sequences */
        cur = 0;
        while (cur < last_pos) {
            int const ml = opt[cur].mlen;
            int const offset = opt[cur].off;
            if (ml == 1) { ip++; cur++; continue; }
            cur += ml;
            if ( LZ4HC_encodeSequence(&ip, &op, &anchor, ml, ip - offset, limit, oend) ) return 0;
        }
    }  /* while (ip < mflimit) */

    /* Encode Last Literals */
    {   int lastRun = (int)(iend - anchor);
        if ((limit) && (((char*)op - dest) + lastRun + 1 + ((lastRun+255-RUN_MASK)/255) > (U32)maxOutputSize)) return 0;  /* Check output limit */
        if (lastRun>=(int)RUN_MASK) { *op++=(RUN_MASK<<ML_BITS); lastRun-=RUN_MASK; for(; lastRun > 254 ; lastRun-=255) *op++ = 255; *op++ = (BYTE) lastRun; }
        else *op++ = (BYTE)(lastRun<<ML_BITS);
        memcpy(op, anchor, iend - anchor);
        op += iend-anchor;
    }

    /* End */
    return (int) ((char*)op-dest);
}